

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O1

int tc_uECC_valid_public_key(uint8_t *public_key,tc_uECC_Curve curve)

{
  int iVar1;
  char cVar2;
  uint uVar3;
  ulong uVar4;
  uint local_68 [2];
  tc_uECC_word_t _public [16];
  
  cVar2 = curve->num_bytes;
  tc_uECC_vli_bytesToNative(local_68,public_key,(int)cVar2);
  tc_uECC_vli_bytesToNative(_public + (long)curve->num_words + -2,public_key + cVar2,(int)cVar2);
  uVar3 = 0xf;
  iVar1 = -4;
  do {
    cVar2 = (char)uVar3;
    if (cVar2 < '\0') {
      return -4;
    }
    uVar4 = (ulong)((uVar3 & 0x7f) << 2);
    uVar3 = uVar3 - 1;
  } while (*(int *)((long)local_68 + uVar4) == *(int *)((long)curve->G + uVar4));
  if (-1 < cVar2) {
    iVar1 = tc_uECC_valid_point(local_68,curve);
  }
  return iVar1;
}

Assistant:

int tc_uECC_valid_public_key(const uint8_t *public_key, tc_uECC_Curve curve)
{

	tc_uECC_word_t _public[NUM_ECC_WORDS * 2];

	tc_uECC_vli_bytesToNative(_public, public_key, curve->num_bytes);
	tc_uECC_vli_bytesToNative(
	_public + curve->num_words,
	public_key + curve->num_bytes,
	curve->num_bytes);

	if (tc_uECC_vli_cmp_unsafe(_public, curve->G, NUM_ECC_WORDS * 2) == 0) {
		return -4;
	}

	return tc_uECC_valid_point(_public, curve);
}